

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::FormulasLoader::end__formula(FormulasLoader *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader).
            super_ExtraDataLoader._vptr_ExtraDataLoader[2])();
  DocumentProcessor::addFormula
            ((DocumentProcessor *)CONCAT44(extraout_var,iVar1),this->mCurrentFormula);
  this->mCurrentFormula = (Formula *)0x0;
  IFilePartLoader::moveUpInSidTree
            (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader);
  return true;
}

Assistant:

bool FormulasLoader::end__formula()
	{
		getHandlingFilePartLoader()->getFileLoader()->addFormula( mCurrentFormula );
		mCurrentFormula = 0;
		getHandlingFilePartLoader()->moveUpInSidTree();

		return true;
	}